

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  IdxElement *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  ulong *puVar6;
  undefined8 *puVar7;
  int in_ECX;
  undefined8 *puVar8;
  IdxCompare *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 in_R8B;
  IdxElement b;
  IdxElement b_00;
  IdxElement b_01;
  IdxElement b_02;
  IdxElement b_03;
  IdxElement b_04;
  IdxElement a;
  IdxElement a_00;
  IdxElement a_01;
  IdxElement a_02;
  IdxElement a_03;
  IdxElement a_04;
  int mid;
  int hi;
  int lo;
  IdxElement tmp;
  IdxElement pivotkey;
  double in_stack_ffffffffffffff18;
  IdxElement *in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff28;
  IdxElement *in_stack_ffffffffffffff30;
  int local_48;
  int local_44;
  bool bVar12;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar13;
  int iVar14;
  int end_00;
  undefined4 in_stack_fffffffffffffff0;
  int iVar15;
  double dVar9;
  double dVar10;
  double dVar11;
  
  uVar13 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0);
  if (in_ECX + 1 < in_ESI) {
    local_48 = in_ESI + -1;
    local_44 = in_ECX;
    while (uVar13 = uVar13 & 0x1ffffff, 0x18 < local_48 - local_44) {
      iVar5 = local_44 + (local_48 - local_44) / 2;
      puVar6 = (ulong *)(in_RDI + (long)iVar5 * 0x10);
      pIVar1 = (IdxElement *)*puVar6;
      dVar11 = (double)puVar6[1];
      iVar14 = local_44;
      iVar15 = local_48;
      while( true ) {
        if ((uVar13 & 0x1000000) == 0) {
          while( true ) {
            bVar12 = false;
            if (local_44 < iVar15) {
              puVar6 = (ulong *)(in_RDI + (long)local_44 * 0x10);
              a_01._0_8_ = *puVar6 & 0xffffffff;
              b_01._0_8_ = (ulong)pIVar1 & 0xffffffff;
              b_01.val = dVar11;
              a_01.val = (double)puVar6[1];
              dVar9 = SPxPricer<double>::IdxCompare::operator()(in_RDX,a_01,b_01);
              bVar12 = dVar9 <= 0.0;
            }
            if (!bVar12) break;
            local_44 = local_44 + 1;
          }
          while( true ) {
            bVar12 = false;
            if (iVar14 < local_48) {
              puVar6 = (ulong *)(in_RDI + (long)local_48 * 0x10);
              a_02._0_8_ = *puVar6 & 0xffffffff;
              b_02._0_8_ = (ulong)pIVar1 & 0xffffffff;
              b_02.val = dVar11;
              a_02.val = (double)puVar6[1];
              in_stack_ffffffffffffff30 = pIVar1;
              dVar9 = SPxPricer<double>::IdxCompare::operator()(in_RDX,a_02,b_02);
              bVar12 = 0.0 < dVar9;
            }
            if (!bVar12) break;
            local_48 = local_48 + -1;
          }
        }
        else {
          while( true ) {
            bVar12 = false;
            if (local_44 < iVar15) {
              puVar6 = (ulong *)(in_RDI + (long)local_44 * 0x10);
              a._0_8_ = *puVar6 & 0xffffffff;
              b._0_8_ = (ulong)pIVar1 & 0xffffffff;
              b.val = dVar11;
              a.val = (double)puVar6[1];
              dVar9 = SPxPricer<double>::IdxCompare::operator()(in_RDX,a,b);
              bVar12 = dVar9 < 0.0;
            }
            if (!bVar12) break;
            local_44 = local_44 + 1;
          }
          while( true ) {
            bVar12 = false;
            if (iVar14 < local_48) {
              puVar6 = (ulong *)(in_RDI + (long)local_48 * 0x10);
              a_00._0_8_ = *puVar6 & 0xffffffff;
              b_00._0_8_ = (ulong)pIVar1 & 0xffffffff;
              b_00.val = dVar11;
              a_00.val = (double)puVar6[1];
              dVar9 = SPxPricer<double>::IdxCompare::operator()(in_RDX,a_00,b_00);
              bVar12 = 0.0 <= dVar9;
            }
            if (!bVar12) break;
            local_48 = local_48 + -1;
          }
        }
        if (local_48 <= local_44) break;
        puVar7 = (undefined8 *)(in_RDI + (long)local_44 * 0x10);
        uVar2 = *puVar7;
        uVar3 = puVar7[1];
        puVar8 = (undefined8 *)(in_RDI + (long)local_48 * 0x10);
        puVar7 = (undefined8 *)(in_RDI + (long)local_44 * 0x10);
        *puVar7 = *puVar8;
        puVar7[1] = puVar8[1];
        puVar7 = (undefined8 *)(in_RDI + (long)local_48 * 0x10);
        *puVar7 = uVar2;
        puVar7[1] = uVar3;
        local_44 = local_44 + 1;
        local_48 = local_48 + -1;
      }
      dVar9 = dVar11;
      if ((uVar13 & 0x1000000) == 0) {
        while( true ) {
          bVar12 = false;
          if (iVar14 < local_48) {
            puVar6 = (ulong *)(in_RDI + (long)local_48 * 0x10);
            a_04._0_8_ = (ulong)pIVar1 & 0xffffffff;
            b_04._0_8_ = *puVar6 & 0xffffffff;
            b_04.val = (double)puVar6[1];
            a_04.val = dVar9;
            dVar11 = SPxPricer<double>::IdxCompare::operator()(in_RDX,a_04,b_04);
            bVar12 = dVar11 <= 0.0;
          }
          if (!bVar12) break;
          local_48 = local_48 + -1;
        }
        if (local_48 == iVar15) {
          puVar7 = (undefined8 *)(in_RDI + (long)local_48 * 0x10);
          uVar2 = *puVar7;
          uVar3 = puVar7[1];
          puVar8 = (undefined8 *)(in_RDI + (long)iVar5 * 0x10);
          puVar7 = (undefined8 *)(in_RDI + (long)local_48 * 0x10);
          *puVar7 = *puVar8;
          puVar7[1] = puVar8[1];
          puVar7 = (undefined8 *)(in_RDI + (long)iVar5 * 0x10);
          *puVar7 = uVar2;
          puVar7[1] = uVar3;
          local_48 = local_48 + -1;
        }
      }
      else {
        while( true ) {
          bVar12 = false;
          dVar9 = dVar11;
          if (local_44 < iVar15) {
            puVar6 = (ulong *)(in_RDI + (long)local_44 * 0x10);
            in_stack_ffffffffffffff18 = (double)puVar6[1];
            a_03._0_8_ = (ulong)pIVar1 & 0xffffffff;
            b_03._0_8_ = *puVar6 & 0xffffffff;
            b_03.val = in_stack_ffffffffffffff18;
            a_03.val = dVar11;
            in_stack_ffffffffffffff20 = pIVar1;
            dVar10 = SPxPricer<double>::IdxCompare::operator()(in_RDX,a_03,b_03);
            bVar12 = 0.0 <= dVar10;
            in_stack_ffffffffffffff28 = dVar11;
          }
          if (!bVar12) break;
          local_44 = local_44 + 1;
          dVar11 = dVar9;
        }
        if (local_44 == iVar14) {
          puVar7 = (undefined8 *)(in_RDI + (long)local_44 * 0x10);
          uVar2 = *puVar7;
          uVar3 = puVar7[1];
          puVar8 = (undefined8 *)(in_RDI + (long)iVar5 * 0x10);
          puVar7 = (undefined8 *)(in_RDI + (long)local_44 * 0x10);
          *puVar7 = *puVar8;
          puVar7[1] = puVar8[1];
          puVar7 = (undefined8 *)(in_RDI + (long)iVar5 * 0x10);
          *puVar7 = uVar2;
          puVar7[1] = uVar3;
          local_44 = local_44 + 1;
        }
      }
      bVar12 = SUB81((ulong)dVar9 >> 0x18,0);
      iVar5 = (int)((ulong)dVar9 >> 0x20);
      end_00 = (int)((ulong)in_RDX >> 0x20);
      if (iVar15 - local_44 < local_48 - iVar14) {
        bVar4 = local_44 < iVar15;
        local_44 = iVar14;
        if (bVar4) {
          SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                    ((IdxElement *)CONCAT44(iVar15,in_stack_fffffffffffffff0),end_00,
                     (IdxCompare *)CONCAT44(iVar14,uVar13),iVar5,bVar12);
          local_44 = iVar14;
        }
      }
      else {
        bVar4 = iVar14 < local_48;
        local_48 = iVar15;
        if (bVar4) {
          SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                    ((IdxElement *)CONCAT44(iVar15,in_stack_fffffffffffffff0),end_00,
                     (IdxCompare *)CONCAT44(iVar14,uVar13),iVar5,bVar12);
          local_48 = iVar15;
        }
      }
      uVar13 = uVar13 ^ 0xff000000;
    }
    if (0 < local_48 - local_44) {
      SPxShellsort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                 (IdxCompare *)in_stack_ffffffffffffff20,
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
  }
  return;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}